

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandShow(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Wlc_Ntk_t *p;
  bool bVar1;
  int iVar2;
  Vec_Int_t *vBold;
  char *pcVar3;
  
  p = (Wlc_Ntk_t *)pAbc->pAbcWlc;
  bVar1 = false;
  Extra_UtilGetoptReset();
  while( true ) {
    do {
      iVar2 = Extra_UtilGetopt(argc,argv,"mvh");
    } while (iVar2 == 0x76);
    if (iVar2 == -1) break;
    if (iVar2 != 0x6d) {
      Abc_Print(-2,"usage: %%show [-mh]\n");
      Abc_Print(-2,"          visualizes the network structure using DOT and GSVIEW\n");
      pcVar3 = "yes";
      if (!bVar1) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-m   :  toggle showing memory subsystem [default = %s]\n",pcVar3);
      pcVar3 = "\t-h   :  print the command usage\n";
      iVar2 = -2;
LAB_00356bf5:
      Abc_Print(iVar2,pcVar3);
      return 1;
    }
    bVar1 = (bool)(bVar1 ^ 1);
  }
  if (p != (Wlc_Ntk_t *)0x0) {
    if (!bVar1) {
      Wlc_NtkShow(p,(Vec_Int_t *)0x0);
      return 0;
    }
    vBold = Wlc_NtkCollectMemory(p,1);
    Wlc_NtkShow(p,vBold);
    if (vBold->pArray != (int *)0x0) {
      free(vBold->pArray);
      vBold->pArray = (int *)0x0;
    }
    if (vBold == (Vec_Int_t *)0x0) {
      return 0;
    }
    free(vBold);
    return 0;
  }
  pcVar3 = "Empty network.\n";
  iVar2 = -1;
  goto LAB_00356bf5;
}

Assistant:

int Abc_CommandShow( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int c;
    int fSeq;
    int fGateNames;
    int fUseReverse;
    int fFlopDep;
    extern void Abc_NtkShow( Abc_Ntk_t * pNtk, int fGateNames, int fSeq, int fUseReverse );
    extern void Abc_NtkShowFlopDependency( Abc_Ntk_t * pNtk );

    // set defaults
    fSeq        = 0;
    fGateNames  = 0;
    fUseReverse = 1;
    fFlopDep    = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "rsgfh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'r':
            fUseReverse ^= 1;
            break;
        case 's':
            fSeq ^= 1;
            break;
        case 'g':
            fGateNames ^= 1;
            break;
        case 'f':
            fFlopDep ^= 1;
            break;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    if ( fFlopDep )
        Abc_NtkShowFlopDependency( pNtk );
    else
        Abc_NtkShow( pNtk, fGateNames, fSeq, fUseReverse );
    return 0;

usage:
    Abc_Print( -2, "usage: show [-srgfh]\n" );
    Abc_Print( -2, "       visualizes the network structure using DOT and GSVIEW\n" );
#ifdef WIN32
    Abc_Print( -2, "       \"dot.exe\" and \"gsview32.exe\" should be set in the paths\n" );
    Abc_Print( -2, "       (\"gsview32.exe\" may be in \"C:\\Program Files\\Ghostgum\\gsview\\\")\n" );
#endif
    Abc_Print( -2, "\t-s    : toggles visualization of sequential networks [default = %s].\n", fSeq? "yes": "no" );
    Abc_Print( -2, "\t-r    : toggles ordering nodes in reverse order [default = %s].\n", fUseReverse? "yes": "no" );
    Abc_Print( -2, "\t-g    : toggles printing gate names for mapped network [default = %s].\n", fGateNames? "yes": "no" );
    Abc_Print( -2, "\t-f    : toggles visualizing flop dependency graph [default = %s].\n", fFlopDep? "yes": "no" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}